

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O3

int jpc_coc_dumpparms(jpc_ms_t *ms,FILE *out)

{
  fprintf((FILE *)out,"compno = %lu; csty = 0x%02x; numdlvls = %d;\n",(ms->parms).sot.tileno,
          (ulong)(ms->parms).coc.compparms.csty,(ulong)(ms->parms).coc.compparms.numdlvls);
  fprintf((FILE *)out,"cblkwidthval = %d; cblkheightval = %d; cblksty = 0x%02x; qmfbid = %d;\n",
          (ulong)(ms->parms).coc.compparms.cblkwidthval,
          (ulong)(ms->parms).coc.compparms.cblkheightval,(ulong)(ms->parms).coc.compparms.cblksty,
          (ulong)(ms->parms).coc.compparms.qmfbid);
  return 0;
}

Assistant:

static int jpc_coc_dumpparms(jpc_ms_t *ms, FILE *out)
{
	jpc_coc_t *coc = &ms->parms.coc;
	fprintf(out, "compno = %"PRIuFAST16"; csty = 0x%02x; numdlvls = %d;\n",
	  coc->compno, coc->compparms.csty, coc->compparms.numdlvls);
	fprintf(out, "cblkwidthval = %d; cblkheightval = %d; "
	  "cblksty = 0x%02x; qmfbid = %d;\n", coc->compparms.cblkwidthval,
	  coc->compparms.cblkheightval, coc->compparms.cblksty, coc->compparms.qmfbid);
	return 0;
}